

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O2

Vec_Int_t * Gia_FlaConvertToGla(Gia_Man_t *p,Vec_Int_t *vFla)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  int iVar3;
  
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  iVar3 = 0;
  while ((iVar3 < p->vCis->nSize - p->nRegs &&
         (pGVar2 = Gia_ManCi(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    Gia_ObjSetTravIdCurrent(p,pGVar2);
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while ((iVar3 < p->nRegs &&
         (pGVar2 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    iVar1 = Vec_IntEntry(vFla,iVar3);
    if (iVar1 == 0) {
      Gia_ObjSetTravIdCurrent(p,pGVar2);
    }
    iVar3 = iVar3 + 1;
  }
  p_00 = Vec_IntStart(p->nObjs);
  iVar3 = 0;
  Vec_IntWriteEntry(p_00,0,1);
  while ((iVar3 < p->vCos->nSize - p->nRegs &&
         (pGVar2 = Gia_ManCo(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    Gia_FlaConvertToGla_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),p_00);
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while( true ) {
    if (p->nRegs <= iVar3) {
      return p_00;
    }
    pGVar2 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar1 = Vec_IntEntry(vFla,iVar3);
    if (iVar1 != 0) {
      Gia_FlaConvertToGla_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),p_00);
    }
    iVar3 = iVar3 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_FlaConvertToGla( Gia_Man_t * p, Vec_Int_t * vFla )
{
    Vec_Int_t * vGla;
    Gia_Obj_t * pObj;
    int i;
    // mark const0 and relevant CI objects
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent(p, Gia_ManConst0(p));
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFla, i) )
            Gia_ObjSetTravIdCurrent(p, pObj);
    // label all objects reachable from the PO and selected flops
    vGla = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntWriteEntry( vGla, 0, 1 );
    Gia_ManForEachPo( p, pObj, i )
        Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFla, i) )
            Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    return vGla;
}